

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
int_writer<unsigned_int,fmt::v6::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  wchar_t *__dest;
  anon_class_40_4_2c7d0318 add_thousands_sep;
  wchar_t *pwVar1;
  size_t __n;
  int digit_index;
  const_iterator group;
  int local_ac;
  num_writer *local_a8;
  num_writer *pnStack_a0;
  undefined8 local_98;
  undefined8 *puStack_90;
  int *local_88;
  undefined8 local_80;
  wchar_t local_78 [22];
  
  pnStack_a0 = this + 0x10;
  local_88 = &local_ac;
  local_ac = 0;
  local_80 = **(undefined8 **)(this + 8);
  puStack_90 = &local_80;
  __dest = *it;
  local_98 = 1;
  add_thousands_sep.s.data_ = (wchar_t *)pnStack_a0;
  add_thousands_sep.this = (num_writer *)this;
  add_thousands_sep.s.size_ = 1;
  add_thousands_sep.group = (const_iterator *)puStack_90;
  add_thousands_sep.digit_index = local_88;
  local_a8 = this;
  pwVar1 = internal::operator()(local_78,*(uint *)this,*(int *)(this + 4),add_thousands_sep);
  __n = (long)pwVar1 - (long)local_78;
  if (__n != 0) {
    memcpy(__dest,local_78,__n);
  }
  *it = (wchar_t *)((long)__dest + __n);
  return;
}

Assistant:

void operator()(It&& it) const {
        basic_string_view<char_type> s(&sep, sep_size);
        // Index of a decimal digit with the least significant digit having
        // index 0.
        int digit_index = 0;
        std::string::const_iterator group = groups.cbegin();
        it = format_decimal<char_type>(
            it, abs_value, size,
            [this, s, &group, &digit_index](char_type*& buffer) {
              if (*group <= 0 || ++digit_index % *group != 0 ||
                  *group == max_value<char>())
                return;
              if (group + 1 != groups.cend()) {
                digit_index = 0;
                ++group;
              }
              buffer -= s.size();
              std::uninitialized_copy(s.data(), s.data() + s.size(),
                                      make_checked(buffer, s.size()));
            });
      }